

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O2

int32_t __thiscall
icu_63::SimpleDateFormat::matchQuarterString
          (SimpleDateFormat *this,UnicodeString *text,int32_t start,UCalendarDateFields field,
          UnicodeString *data,int32_t dataCount,Calendar *cal)

{
  int32_t iVar1;
  ulong uVar2;
  int32_t iVar3;
  ulong uVar4;
  ulong uVar5;
  UnicodeString bestMatchName;
  
  bestMatchName.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_00471e80;
  bestMatchName.fUnion.fStackFields.fLengthAndFlags = 2;
  uVar2 = 0;
  uVar4 = (ulong)(uint)dataCount;
  if (dataCount < 1) {
    uVar4 = uVar2;
  }
  uVar5 = 0xffffffffffffffff;
  iVar3 = 0;
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = matchStringWithOptionalDot(text,start,data);
    if (iVar3 < iVar1) {
      uVar5 = uVar2;
      iVar3 = iVar1;
    }
    uVar5 = uVar5 & 0xffffffff;
    data = data + 1;
  }
  if ((int)uVar5 < 0) {
    iVar3 = -start;
  }
  else {
    Calendar::set(cal,field,(int)uVar5 * 3);
    iVar3 = iVar3 + start;
  }
  icu_63::UnicodeString::~UnicodeString(&bestMatchName);
  return iVar3;
}

Assistant:

int32_t SimpleDateFormat::matchQuarterString(const UnicodeString& text,
                              int32_t start,
                              UCalendarDateFields field,
                              const UnicodeString* data,
                              int32_t dataCount,
                              Calendar& cal) const
{
    int32_t i = 0;
    int32_t count = dataCount;

    // There may be multiple strings in the data[] array which begin with
    // the same prefix (e.g., Cerven and Cervenec (June and July) in Czech).
    // We keep track of the longest match, and return that.  Note that this
    // unfortunately requires us to test all array elements.
    int32_t bestMatchLength = 0, bestMatch = -1;
    UnicodeString bestMatchName;

    for (; i < count; ++i) {
        int32_t matchLength = 0;
        if ((matchLength = matchStringWithOptionalDot(text, start, data[i])) > bestMatchLength) {
            bestMatchLength = matchLength;
            bestMatch = i;
        }
    }

    if (bestMatch >= 0) {
        cal.set(field, bestMatch * 3);
        return start + bestMatchLength;
    }

    return -start;
}